

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

void * hashtable_iter_at(hashtable_t *hashtable,char *key)

{
  uint32_t uVar1;
  size_t length;
  pair_t *ppVar2;
  bucket_t *bucket;
  size_t hash;
  pair_t *pair;
  char *key_local;
  hashtable_t *hashtable_local;
  
  length = strlen(key);
  uVar1 = hashlittle(key,length,hashtable_seed);
  ppVar2 = hashtable_find_pair(hashtable,
                               hashtable->buckets +
                               (uVar1 & (1 << ((byte)hashtable->order & 0x1f)) - 1U),key,
                               (ulong)uVar1);
  if (ppVar2 == (pair_t *)0x0) {
    hashtable_local = (hashtable_t *)0x0;
  }
  else {
    hashtable_local = (hashtable_t *)&ppVar2->ordered_list;
  }
  return hashtable_local;
}

Assistant:

void *hashtable_iter_at(hashtable_t *hashtable, const char *key)
{
    pair_t *pair;
    size_t hash;
    bucket_t *bucket;

    hash = hash_str(key);
    bucket = &hashtable->buckets[hash & hashmask(hashtable->order)];

    pair = hashtable_find_pair(hashtable, bucket, key, hash);
    if(!pair)
        return NULL;

    return &pair->ordered_list;
}